

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# node.hpp
# Opt level: O0

void __thiscall node::backward(node *this)

{
  double dVar1;
  double dVar2;
  undefined8 *puVar3;
  size_type sVar4;
  reference pvVar5;
  reference pptVar6;
  int local_14;
  int i;
  node *this_local;
  
  if ((this->isbuild & 1U) == 0) {
    puVar3 = (undefined8 *)__cxa_allocate_exception(8);
    *puVar3 = "backward before forward!";
    __cxa_throw(puVar3,&char_const*::typeinfo,0);
  }
  local_14 = 0;
  while( true ) {
    sVar4 = std::vector<tensor_*,_std::allocator<tensor_*>_>::size(&this->input);
    if (sVar4 <= (ulong)(long)local_14) break;
    pvVar5 = std::vector<double,_std::allocator<double>_>::operator[](&this->grad_fn,(long)local_14)
    ;
    dVar1 = *pvVar5;
    dVar2 = this->ret->grad;
    pptVar6 = std::vector<tensor_*,_std::allocator<tensor_*>_>::operator[]
                        (&this->input,(long)local_14);
    (*pptVar6)->grad = dVar1 * dVar2 + (*pptVar6)->grad;
    pptVar6 = std::vector<tensor_*,_std::allocator<tensor_*>_>::operator[]
                        (&this->input,(long)local_14);
    (*pptVar6)->cnt = (*pptVar6)->cnt + -1;
    local_14 = local_14 + 1;
  }
  return;
}

Assistant:

virtual void backward(){  //把ret的梯度传向input
        if(!isbuild)  //如果没有forward，无法传梯度。
            throw "backward before forward!";
        for(int i=0;i<input.size();i++){
            input[i]->grad+=grad_fn[i]*ret->grad;
            input[i]->cnt--;

        }
    }